

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_encoder.h
# Opt level: O0

void rc_reset(lzma_range_encoder *rc)

{
  lzma_range_encoder *rc_local;
  
  rc->low = 0;
  rc->cache_size = 1;
  rc->range = 0xffffffff;
  rc->cache = '\0';
  rc->count = 0;
  rc->pos = 0;
  return;
}

Assistant:

static inline void
rc_reset(lzma_range_encoder *rc)
{
	rc->low = 0;
	rc->cache_size = 1;
	rc->range = UINT32_MAX;
	rc->cache = 0;
	rc->count = 0;
	rc->pos = 0;
}